

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExecFPU_cpp.h
# Opt level: O1

bool __thiscall moira::Moira::isValidExtFPU(Moira *this,Instr I,Mode M,u16 op,u32 ext)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  
  if (9 < I - FDBcc) {
    if (I == FMOVECR) {
      uVar2 = op & 0x3f;
      goto LAB_0012ef47;
    }
    if (I != FTRAPcc) goto switchD_0012eefa_caseD_1;
switchD_0012eefa_caseD_0:
    uVar2 = ext & 0xffe0;
LAB_0012ef47:
    return uVar2 == 0;
  }
  uVar2 = ext >> 0xd & 7;
  switch(I) {
  case FDBcc:
  case FScc:
    goto switchD_0012eefa_caseD_0;
  default:
switchD_0012eefa_caseD_1:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/dirkwhoffmann[P]Moira/Moira/MoiraExecFPU_cpp.h"
                  ,0x74,"bool moira::Moira::isValidExtFPU(Instr, Mode, u16, u32) const");
  case FMOVE:
    break;
  case FMOVEM:
    goto switchD_0012eefa_caseD_3;
  }
  switch(uVar2) {
  case 0:
    uVar1 = ext & 0x7f;
    bVar3 = (op & 0x3f) == 0;
LAB_0012ef18:
    if ((bool)(bVar3 | uVar1 != 0)) {
      return true;
    }
    break;
  case 1:
    goto switchD_0012ef0c_caseD_1;
  case 2:
    if (M != IP) {
      return true;
    }
    break;
  case 3:
    if ((ext & 0xc00) == 0xc00 || (ext & 0x7f) == 0) {
      if (M == AN) {
        if ((ext & 0xc00) != 0xc00) goto LAB_0012efb7;
      }
      else if ((M != DN) || (((ext & 0x1800) != 0x800 && ((ext & 0x1400) != 0x1400)))) {
LAB_0012efb7:
        if (3 < M - DIPC) {
          uVar1 = ~ext & 0x1c00;
          bVar3 = (ext & 0xf) == 0;
          goto LAB_0012ef18;
        }
      }
    }
    break;
  case 4:
    goto switchD_0012ef0c_caseD_4;
  case 5:
    goto switchD_0012ef0c_caseD_5;
  default:
    goto switchD_0012ef0c_caseD_6;
  }
switchD_0012eefa_caseD_3:
  if (uVar2 - 6 < 2) {
switchD_0012ef0c_caseD_6:
    if (((((ext & 0x700) == 0) && (uVar1 = ext >> 0xb & 3, (ext & 0x8f) == 0 || uVar1 != 3)) &&
        ((IP < M || ((0x1e03U >> (M & 0x1f) & 1) == 0)))) && (M != AI || 1 < uVar1)) {
      if (M == PD) {
        if (uVar2 == 6) {
          return false;
        }
        if ((((ext & 0x8f) != 0) && (uVar2 == 7)) && (uVar1 == 1)) {
          return false;
        }
        if (((byte)(ext >> 0xc) & uVar2 == 7) != 0) {
          return false;
        }
      }
      else if ((M == PI) && (uVar2 == 7 || uVar1 < 2)) {
        return false;
      }
      if (3 < M - DI || 1 < uVar1) {
        return true;
      }
    }
  }
  else if (uVar2 == 4) {
switchD_0012ef0c_caseD_4:
    if (M != IP && (ext & 0x3ff) == 0) {
      return true;
    }
  }
  else if (uVar2 == 5) {
switchD_0012ef0c_caseD_5:
    if (((ext & 0x3ff) == 0) &&
       (((AN < M || ((uVar2 = ext >> 10 & 7, uVar2 < 5 && (uVar2 != 3)))) && (3 < M - DIPC)))) {
      return true;
    }
  }
switchD_0012ef0c_caseD_1:
  return false;
}

Assistant:

bool
Moira::isValidExtFPU(Instr I, Mode M, u16 op, u32 ext) const
{
    auto cod  = xxx_____________ (ext);
    auto mode = ___xx___________ (ext);
    auto fmt  = ___xxx__________ (ext);
    auto lst  = ___xxx__________ (ext);
    auto cmd  = _________xxxxxxx (ext);

    switch (I) {

        case Instr::FDBcc:
        case Instr::FScc:
        case Instr::FTRAPcc:

            return (ext & 0xFFE0) == 0;

        case Instr::FMOVECR:

            return (op & 0x3F) == 0;

        case Instr::FMOVE:

            switch (cod) {

                case 0b010:

                    if (M == Mode::IP) break;
                    return true;

                case 0b000:

                    if (cmd == 0 && cod == 0 && (op & 0x3F)) break;
                    return true;

                case 0b011:

                    if (fmt != 0b011 && fmt != 0b111 && (ext & 0x7F)) break;

                    if (M == Mode::DN) {
                        if (fmt == 0b010 || fmt == 0b011 || fmt == 0b101 || fmt == 0b111) break;
                    }
                    if (M == Mode::AN) {
                        if (fmt == 0b011 || fmt == 0b111) break;
                    }
                    if (M == Mode::DIPC || M == Mode::IXPC || M == Mode::IM || M == Mode::IP) {
                        break;
                    } else {
                        if (fmt == 0b111 && (ext & 0xF)) break;
                    }

                    return true;
            }

        case Instr::FMOVEM:

            switch (cod) {

                case 0b101:
                {

                    if (ext & 0x3FF) break;

                    if (M == Mode::DN || M == Mode::AN) {
                        if (lst != 0b000 && lst != 0b001 && lst != 0b010 && lst != 0b100) break;
                    }
                    if (M == Mode::DIPC || M == Mode::IXPC || M == Mode::IM || M == Mode::IP) {
                        break;
                    }
                    return true;
                }
                case 0b100:

                    if (ext & 0x3FF) break;
                    if (M == Mode::IP) break;
                    return true;

                case 0b110:
                case 0b111:

                    if (ext & 0x0700) break;
                    if (mode == 3 && (ext & 0x8F)) break;

                    if (M == Mode::DN || M == Mode::AN) {
                        break;
                    }
                    if (M == Mode::DIPC || M == Mode::IXPC || M == Mode::IM || M == Mode::IP) {
                        break;
                    }
                    if (M == Mode::AI) {
                        if (mode == 0 || mode == 1) break;
                    }
                    if (M == Mode::PI) {
                        if (mode == 0 || mode == 1 || cod == 0b111) break;
                    }
                    if (M == Mode::PD) {
                        if (cod == 0b110) break;
                        if (cod == 0b111 && (mode == 1) && (ext & 0x8F)) break;
                        if (cod == 0b111 && (mode == 2 || mode == 3)) break;
                    }
                    if (M == Mode::DI || M == Mode::IX || M == Mode::AW || M == Mode::AL) {
                        if (mode == 0 || mode == 1) break;
                    }
                    return true;
            }
            return false;

        default:
            fatalError;
    }
}